

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O2

void Eigen::internal::gemv_selector<2,1,true>::
     run<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,4>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
               (GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>
                *prod,Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *dest,Scalar *alpha)

{
  size_t size;
  Nested pMVar1;
  Nested pMVar2;
  long rows;
  double *lhs;
  long cols;
  double *pdVar3;
  long rhsIncr;
  undefined8 alpha_00;
  double *rhs;
  BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
  *pBVar4;
  BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
  local_78;
  undefined1 local_50 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  
  pMVar1 = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
           ).m_lhs.m_matrix;
  pMVar2 = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
           ).m_rhs.m_matrix.m_matrix;
  actualRhsPtr_stack_memory_destructor._16_8_ = *alpha;
  actualRhsPtr_stack_memory_destructor.m_ptr =
       (double *)
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((ulong)actualRhsPtr_stack_memory_destructor.m_ptr >> 0x3d != 0) {
    throw_std_bad_alloc();
    actualRhsPtr_stack_memory_destructor.m_ptr =
         (double *)
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  }
  rhs = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (rhs == (double *)0x0) {
    size = (long)actualRhsPtr_stack_memory_destructor.m_ptr * 8;
    if (size < 0x20001) {
      rhs = (double *)((long)&local_78 - (size + 0xf & 0xfffffffffffffff0));
      local_50 = (undefined1  [8])rhs;
      pBVar4 = (BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
                *)rhs;
    }
    else {
      rhs = (double *)aligned_malloc(size);
      actualRhsPtr_stack_memory_destructor.m_ptr =
           (double *)
           (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      local_50 = (undefined1  [8])(double *)0x0;
      pBVar4 = &local_78;
      if ((pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          == (double *)0x0) {
        local_50 = (undefined1  [8])rhs;
        pBVar4 = &local_78;
      }
    }
  }
  else {
    local_50 = (undefined1  [8])(double *)0x0;
    pBVar4 = &local_78;
  }
  actualRhsPtr_stack_memory_destructor.m_size._0_1_ =
       0x20000 < (ulong)((long)actualRhsPtr_stack_memory_destructor.m_ptr * 8);
  rows = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  lhs = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  cols = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  pdVar3 = (dest->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
           m_storage.m_data;
  *(undefined8 *)((long)pBVar4 + -8) = 0x110352;
  BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_-1,_1,_true,_true>::
  BlockImpl_dense(&local_78,dest,0);
  *(undefined8 *)((long)pBVar4 + -8) = 1;
  alpha_00 = actualRhsPtr_stack_memory_destructor._16_8_;
  rhsIncr = *(long *)((long)pBVar4 + -8);
  *(undefined8 *)((long)pBVar4 + -8) = 1;
  *(double **)((long)pBVar4 + -0x10) = pdVar3;
  *(undefined8 *)((long)pBVar4 + -0x18) = 0x110372;
  general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
            (rows,cols,lhs,cols,rhs,rhsIncr,*(ResScalar **)((long)pBVar4 + -0x10),
             (long)*(double *)((long)pBVar4 + -8),(ResScalar)alpha_00);
  *(undefined8 *)((long)pBVar4 + -8) = 0x11037d;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_50);
  return;
}

Assistant:

static void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::LhsScalar LhsScalar;
    typedef typename ProductType::RhsScalar RhsScalar;
    typedef typename ProductType::Scalar    ResScalar;
    typedef typename ProductType::Index Index;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::_ActualRhsType _ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(prod.lhs());
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = _ActualRhsType::InnerStrideAtCompileTime==1
    };

    gemv_static_vector_if<RhsScalar,_ActualRhsType::SizeAtCompileTime,_ActualRhsType::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename _ActualRhsType::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    general_matrix_vector_product
      <Index,LhsScalar,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhsPtr, 1,
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }